

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O1

int ll_insert_after(ll_head *q_head,ll_elem *n,ll_elem *rel,int wait)

{
  atomic_size_t *paVar1;
  long *plVar2;
  atomic_size_t aVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ll_elem *plVar8;
  ll_elem *plVar9;
  bool bVar10;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x406,
                  "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
  }
  plVar9 = (ll_elem *)((ulong)n & 0xfffffffffffffffc);
  if (plVar9 != n) {
    __assert_fail("n == ptr_clear(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x407,
                  "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
  }
  if ((ll_elem *)((ulong)rel & 0xfffffffffffffffc) != rel) {
    __assert_fail("rel == ptr_clear(rel)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x408,
                  "int ll_insert_after(struct ll_head *, struct ll_elem *, struct ll_elem *, int)");
  }
  if (wait == 0) {
    uVar6 = 0;
LAB_0010282f:
    LOCK();
    uVar7 = n->succ;
    bVar10 = uVar6 == uVar7;
    if (bVar10) {
      n->succ = uVar6 | 2;
      uVar7 = uVar6;
    }
    UNLOCK();
    if (!bVar10) goto code_r0x00102840;
    uVar6 = n->pred;
    while (1 < uVar6) {
      uVar6 = n->pred;
    }
LAB_0010285e:
    if (!bVar10) {
      return 0;
    }
    goto LAB_00102868;
  }
  unlink_release((ll_head *)n,(ll_elem *)0x1,(int)rel);
LAB_00102868:
  LOCK();
  plVar9->refcnt = plVar9->refcnt + 1;
  UNLOCK();
  LOCK();
  paVar1 = &((ll_elem *)((ulong)rel & 0xfffffffffffffffc))->refcnt;
  *paVar1 = *paVar1 + 1;
  UNLOCK();
  while( true ) {
    plVar8 = succ(q_head,rel);
    plVar8 = (ll_elem *)((ulong)plVar8 & 0xfffffffffffffffc);
    iVar5 = insert_between(q_head,n,rel,plVar8);
    if (iVar5 != 0) break;
    LOCK();
    paVar1 = &plVar8->refcnt;
    aVar3 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
    if (aVar3 == 0) goto LAB_00102932;
    if ((*(ulong *)(((ulong)rel & 0xfffffffffffffffc) + 8) & 2) != 0) {
      plVar8 = pred(q_head,rel);
      LOCK();
      plVar2 = (long *)(((ulong)rel & 0xfffffffffffffffc) + 0x10);
      lVar4 = *plVar2;
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (lVar4 == 0) goto LAB_00102932;
      rel = (ll_elem *)((ulong)plVar8 & 0xfffffffffffffffc);
    }
  }
  LOCK();
  plVar2 = (long *)(((ulong)rel & 0xfffffffffffffffc) + 0x10);
  lVar4 = *plVar2;
  *plVar2 = *plVar2 + -1;
  UNLOCK();
  if (lVar4 != 0) {
    LOCK();
    paVar1 = &plVar8->refcnt;
    aVar3 = *paVar1;
    *paVar1 = *paVar1 - 1;
    UNLOCK();
    if (aVar3 != 0) {
      LOCK();
      paVar1 = &plVar9->refcnt;
      aVar3 = *paVar1;
      *paVar1 = *paVar1 - 1;
      UNLOCK();
      if (aVar3 != 0) {
        return 1;
      }
    }
  }
LAB_00102932:
  __assert_fail("old >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x9a,
                "void deref_release(struct ll_head *, struct ll_elem *, size_t)");
code_r0x00102840:
  uVar6 = uVar7;
  if (1 < uVar7) goto LAB_0010285e;
  goto LAB_0010282f;
}

Assistant:

int
ll_insert_after(struct ll_head *q_head, struct ll_elem *n,
    struct ll_elem *rel, int wait)
{
	struct ll_elem	*q, *s, *p, *p_;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));
	assert(rel == ptr_clear(rel));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	/* This is insert_after, so rel is the predecessor. */
	s = NULL;
	p = rel;
	deref_acquire(p, 1);	/* Our local reference. */

	/* Lookup successor. */
	s = ptr_clear(succ(q_head, p));

	/*
	 * We now have:
	 * - p -- the predecessor of the insert position
	 * - s -- the successor of the insert position
	 * - n -- the node we need to insert between p and s
	 *
	 * Note that both p and s may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, p, s)) {
		/*
		 * Insert failed.
		 * This means at least one of p and s is no longer suitable.
		 * Forget s, fix p and re-resolve s.
		 */

		/* Forget s. */
		deref_release(q_head, s, 1);

		/* Fix p:
		 * if it is deleted, we need to insert after its predecessor.
		 */
		if (deleted(p)) {
			p_ = p;
			p = ptr_clear(pred(q_head, p));
			deref_release(q_head, p_, 1);
		}

		/* Find correct s. */
		s = ptr_clear(succ(q_head, p));
	}

	/*
	 * We have succesfully inserted n.
	 * Release our references on n, p and s.
	 */
	deref_release(q_head, p, 1);
	deref_release(q_head, s, 1);
	deref_release(q_head, n, 1);
	return 1;
}